

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Vec_Ptr_t * Aig_ManSupportNodes(Aig_Man_t *p,Vec_Ptr_t *vParts)

{
  int i;
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *vSupport;
  Aig_Obj_t *pAVar1;
  int i_00;
  int i_01;
  
  Aig_ManSetCioIds(p);
  p_00 = Vec_PtrAlloc(vParts->nSize);
  for (i_00 = 0; i_00 < vParts->nSize; i_00 = i_00 + 1) {
    p_01 = (Vec_Int_t *)Vec_PtrEntry(vParts,i_00);
    vSupport = Vec_IntAlloc(100);
    Aig_ManIncrementTravId(p);
    p->pConst1->TravId = p->nTravIds;
    for (i_01 = 0; i_01 < p_01->nSize; i_01 = i_01 + 1) {
      i = Vec_IntEntry(p_01,i_01);
      pAVar1 = Aig_ManCo(p,i);
      Aig_ManSupportNodes_rec(p,(Aig_Obj_t *)((ulong)pAVar1->pFanin0 & 0xfffffffffffffffe),vSupport)
      ;
    }
    Vec_PtrPush(p_00,vSupport);
  }
  Aig_ManCleanCioIds(p);
  return p_00;
}

Assistant:

Vec_Ptr_t * Aig_ManSupportNodes( Aig_Man_t * p, Vec_Ptr_t * vParts )
{
    Vec_Ptr_t * vPartSupps;
    Vec_Int_t * vPart, * vSupport;
    int i, k, iOut;
    Aig_ManSetCioIds( p );
    vPartSupps = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        vSupport = Vec_IntAlloc( 100 );
        Aig_ManIncrementTravId( p );
        Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
        Vec_IntForEachEntry( vPart, iOut, k )
            Aig_ManSupportNodes_rec( p, Aig_ObjFanin0(Aig_ManCo(p, iOut)), vSupport );
//        Vec_IntSort( vSupport, 0 );
        Vec_PtrPush( vPartSupps, vSupport );
    }
    Aig_ManCleanCioIds( p );
    return vPartSupps;
}